

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcUnroll.c
# Opt level: O2

void Unr_ManSetup(Unr_Man_t *p,int fVerbose)

{
  Vec_Int_t **p_00;
  Vec_Int_t **p_01;
  Vec_Int_t **p_02;
  Vec_Int_t **p_03;
  Gia_Man_t *pGVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  abctime aVar8;
  Vec_Int_t *pVVar9;
  Vec_Int_t *pVVar10;
  Gia_Obj_t *pGVar11;
  int *piVar12;
  Unr_Obj_t *pUVar13;
  abctime aVar14;
  ulong uVar15;
  ulong uVar16;
  abctime time;
  int iVar17;
  Vec_Int_t *vRoots;
  size_t __nmemb;
  Vec_Int_t *vMap;
  
  aVar8 = Abc_Clock();
  if (p->vOrder->nSize != 0) {
    __assert_fail("Vec_IntSize(p->vOrder) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcUnroll.c"
                  ,0xc2,"void Unr_ManSetup(Unr_Man_t *, int)");
  }
  p_00 = &p->vOrder;
  iVar17 = 0;
  Vec_IntPush(p->vOrder,0);
  p_01 = &p->vOrderLim;
  Vec_IntPush(p->vOrderLim,p->vOrder->nSize);
  p_02 = &p->vTents;
  Vec_IntWriteEntry(p->vTents,0,0);
  p_03 = &p->vRanks;
  Vec_IntWriteEntry(p->vRanks,0,0);
  pVVar9 = Vec_IntAlloc(100);
  pVVar10 = Vec_IntAlloc(100);
  while ((pGVar1 = p->pGia, iVar17 < pGVar1->vCos->nSize - pGVar1->nRegs &&
         (pGVar11 = Gia_ManCo(pGVar1,iVar17), pGVar11 != (Gia_Obj_t *)0x0))) {
    iVar2 = Gia_ObjId(p->pGia,pGVar11);
    Unr_ManSetup_rec(p,iVar2,0,pVVar9);
    iVar17 = iVar17 + 1;
  }
  while (vRoots = pVVar10, pVVar10 = pVVar9, iVar17 = pVVar10->nSize,
        Vec_IntPush(*p_01,(*p_00)->nSize), 0 < iVar17) {
    vRoots->nSize = 0;
    for (iVar17 = 0; pVVar9 = vRoots, iVar17 < pVVar10->nSize; iVar17 = iVar17 + 1) {
      iVar2 = Vec_IntEntry(pVVar10,iVar17);
      Unr_ManSetup_rec(p,iVar2,p->vOrderLim->nSize + -1,vRoots);
    }
  }
  Vec_IntFree(pVVar10);
  Vec_IntFree(vRoots);
  iVar2 = 0;
  for (iVar17 = 0; iVar17 < (*p_00)->nSize; iVar17 = iVar17 + 1) {
    iVar3 = Vec_IntEntry(*p_00,iVar17);
    iVar3 = Vec_IntEntry(*p_03,iVar3);
    iVar2 = iVar2 + (iVar3 + 1U & 0xfffffffe) + 6;
  }
  __nmemb = (size_t)iVar2;
  piVar12 = (int *)calloc(__nmemb,4);
  p->pObjs = piVar12;
  p->pEnd = piVar12 + __nmemb;
  pUVar13 = Unr_ManObj(p,0);
  iVar17 = Vec_IntEntry(p->vRanks,0);
  *(ulong *)&pUVar13->field_0x8 =
       *(ulong *)&pUVar13->field_0x8 & 0xfffe000300000003 | (ulong)(iVar17 + 1U & 0x7fff) << 0x22 |
       0xfffffffc;
  pUVar13->Res[0] = 0;
  pVVar9 = Vec_IntStartFull(p->nObjs);
  vMap = pVVar9;
  Vec_IntWriteEntry(pVVar9,0,(int)((ulong)((long)piVar12 - (long)p->pObjs) >> 2));
  if (p->vObjLim->nSize != 0) {
    __assert_fail("Vec_IntSize(p->vObjLim) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcUnroll.c"
                  ,0xe8,"void Unr_ManSetup(Unr_Man_t *, int)");
  }
  piVar12 = piVar12 + (ulong)((uint)((ulong)*(undefined8 *)&pUVar13->field_0x8 >> 0x22) & 0x7ffe) +
                      6;
  for (iVar17 = (*p_01)->nSize + -2; -1 < iVar17; iVar17 = iVar17 + -1) {
    iVar3 = Vec_IntEntry(p->vOrderLim,iVar17);
    iVar4 = Vec_IntEntry(p->vOrderLim,iVar17 + 1);
    Vec_IntPush(p->vObjLim,(int)((ulong)((long)piVar12 - (long)p->pObjs) >> 2));
    for (; iVar3 < iVar4; iVar3 = iVar3 + 1) {
      uVar5 = Vec_IntEntry(p->vOrder,iVar3);
      pGVar11 = Gia_ManObj(p->pGia,uVar5);
      pUVar13 = Unr_ManObj(p,(int)((ulong)((long)piVar12 - (long)p->pObjs) >> 2));
      *(ulong *)&pUVar13->field_0x8 = *(ulong *)&pUVar13->field_0x8 | 0xfffffffc;
      if ((~*(uint *)pGVar11 & 0x1fffffff) == 0) {
LAB_004af149:
        iVar6 = Gia_ObjIsRo(p->pGia,pGVar11);
        if (iVar6 != 0) {
          uVar15 = *(ulong *)&pUVar13->field_0x8 & 0xfffffffffffe0003;
          goto LAB_004af1c3;
        }
      }
      else {
        iVar6 = Vec_IntEntry(*p_02,uVar5);
        uVar7 = Vec_IntEntry(*p_02,uVar5 - (*(uint *)pGVar11 & 0x1fffffff));
        uVar7 = ~uVar7 + iVar6;
        if ((int)uVar7 < 1) {
          uVar7 = 0;
        }
        *(ulong *)&pUVar13->field_0x8 =
             (*(ulong *)&pUVar13->field_0x8 & 0xfffffffffffe0003) + (ulong)(uVar7 & 0x7fff) * 4;
        if ((int)*(uint *)pGVar11 < 0 || (~*(uint *)pGVar11 & 0x1fffffff) == 0) goto LAB_004af149;
        iVar6 = Vec_IntEntry(*p_02,uVar5);
        uVar7 = Vec_IntEntry(*p_02,uVar5 - (*(uint *)&pGVar11->field_0x4 & 0x1fffffff));
        iVar6 = ~uVar7 + iVar6;
        if (iVar6 < 1) {
          iVar6 = 0;
        }
        uVar15 = *(ulong *)&pUVar13->field_0x8 & 0xffffffff0001ffff | (ulong)(uint)(iVar6 << 0x11);
LAB_004af1c3:
        *(ulong *)&pUVar13->field_0x8 = uVar15;
      }
      iVar6 = Vec_IntEntry(*p_03,uVar5);
      uVar15 = (ulong)(iVar6 + 1U & 0x7fff);
      *(ulong *)&pUVar13->field_0x8 =
           *(ulong *)&pUVar13->field_0x8 & 0x3ffffffff | uVar15 << 0x22 | 0xfffe000000000000;
      pUVar13->OrigId = uVar5;
      for (uVar16 = 0; uVar16 < uVar15; uVar16 = uVar16 + 1) {
        pUVar13->Res[uVar16] = 0xffffffff;
      }
      uVar15 = (long)piVar12 - (long)p->pObjs;
      if ((uVar15 & 4) != 0) {
        __assert_fail("((pInts - p->pObjs) & 1) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcUnroll.c"
                      ,0xfe,"void Unr_ManSetup(Unr_Man_t *, int)");
      }
      Vec_IntWriteEntry(pVVar9,uVar5,(int)(uVar15 >> 2));
      piVar12 = piVar12 + (ulong)((uint)((ulong)*(undefined8 *)&pUVar13->field_0x8 >> 0x22) & 0x7ffe
                                 ) + 6;
    }
  }
  if ((long)piVar12 - (long)p->pObjs >> 2 != __nmemb) {
    __assert_fail("pInts - p->pObjs == nInts",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcUnroll.c"
                  ,0x103,"void Unr_ManSetup(Unr_Man_t *, int)");
  }
  iVar17 = 0;
  do {
    if ((p->pGia->nObjs <= iVar17) ||
       (pGVar11 = Gia_ManObj(p->pGia,iVar17), pGVar11 == (Gia_Obj_t *)0x0)) {
      iVar17 = 0;
      while ((iVar17 < p->pGia->vCis->nSize &&
             (pGVar11 = Gia_ManCi(p->pGia,iVar17), pGVar11 != (Gia_Obj_t *)0x0))) {
        pVVar10 = p->vCiMap;
        iVar3 = Gia_ObjId(p->pGia,pGVar11);
        iVar3 = Vec_IntEntry(pVVar9,iVar3);
        Vec_IntPush(pVVar10,iVar3);
        iVar17 = iVar17 + 1;
      }
      iVar17 = 0;
      while ((iVar17 < p->pGia->vCos->nSize &&
             (pGVar11 = Gia_ManCo(p->pGia,iVar17), pGVar11 != (Gia_Obj_t *)0x0))) {
        pVVar10 = p->vCoMap;
        iVar3 = Gia_ObjId(p->pGia,pGVar11);
        iVar3 = Vec_IntEntry(pVVar9,iVar3);
        Vec_IntPush(pVVar10,iVar3);
        iVar17 = iVar17 + 1;
      }
      Vec_IntFreeP(&vMap);
      if (fVerbose != 0) {
        Unr_ManProfileRanks(*p_03);
        printf("Memory usage = %6.2f MB  ",(double)iVar2 * 4.0 * 9.5367431640625e-07);
        aVar14 = Abc_Clock();
        Abc_PrintTime(0x816bba,(char *)(aVar14 - aVar8),time);
      }
      Vec_IntFreeP(p_00);
      Vec_IntFreeP(p_01);
      Vec_IntFreeP(p_03);
      Vec_IntFreeP(p_02);
      return;
    }
    iVar3 = Vec_IntEntry(pVVar9,iVar17);
    if (iVar3 != -1) {
      iVar3 = Vec_IntEntry(pVVar9,iVar17);
      pUVar13 = Unr_ManObj(p,iVar3);
      if ((~(uint)*(undefined8 *)pGVar11 & 0x1fffffff) != 0) {
        uVar5 = Vec_IntEntry(pVVar9,iVar17 - ((uint)*(undefined8 *)pGVar11 & 0x1fffffff));
        pUVar13->hFan0 = uVar5;
        uVar15 = *(ulong *)&pUVar13->field_0x8 & 0xfffffffffffffffe |
                 (ulong)(*(uint *)pGVar11 >> 0x1d & 1);
        *(ulong *)&pUVar13->field_0x8 = uVar15;
        if ((~*(uint *)pGVar11 & 0x1fffffff) == 0 || -1 < (int)*(uint *)pGVar11) {
          uVar16 = 0;
        }
        else {
          pGVar1 = p->pGia;
          iVar3 = Gia_ObjCioId(pGVar11);
          uVar16 = (ulong)(iVar3 < pGVar1->vCos->nSize - pGVar1->nRegs) << 0x21;
          uVar15 = *(ulong *)&pUVar13->field_0x8;
        }
        *(ulong *)&pUVar13->field_0x8 = uVar15 & 0xfffffffdffffffff | uVar16;
        uVar5 = (uint)*(undefined8 *)pGVar11;
        if (-1 < (int)uVar5 && (~uVar5 & 0x1fffffff) != 0) {
          uVar5 = Vec_IntEntry(pVVar9,iVar17 - ((uint)((ulong)*(undefined8 *)pGVar11 >> 0x20) &
                                               0x1fffffff));
          pUVar13->hFan1 = uVar5;
          *(ulong *)&pUVar13->field_0x8 =
               *(ulong *)&pUVar13->field_0x8 & 0xfffffffffffffffd |
               (ulong)((uint)((ulong)*(undefined8 *)pGVar11 >> 0x3c) & 2);
          goto LAB_004af46d;
        }
      }
      iVar3 = Gia_ObjIsRo(p->pGia,pGVar11);
      if (iVar3 == 0) {
        if ((((uint)*(undefined8 *)pGVar11 & 0x9fffffff) == 0x9fffffff) &&
           (pGVar1 = p->pGia, iVar3 = Gia_ObjCioId(pGVar11),
           iVar3 < pGVar1->vCis->nSize - pGVar1->nRegs)) {
          uVar5 = Gia_ObjCioId(pGVar11);
          pUVar13->hFan0 = uVar5;
          uVar5 = Vec_IntEntry(*p_02,iVar17);
          pUVar13->hFan1 = uVar5;
          *(ulong *)&pUVar13->field_0x8 = *(ulong *)&pUVar13->field_0x8 | 0x100000000;
        }
      }
      else {
        pGVar1 = p->pGia;
        pGVar11 = Gia_ObjRoToRi(pGVar1,pGVar11);
        iVar3 = Gia_ObjId(pGVar1,pGVar11);
        uVar5 = Vec_IntEntry(pVVar9,iVar3);
        pUVar13->hFan0 = uVar5;
        pUVar13->field_0x8 = pUVar13->field_0x8 & 0xfe;
      }
    }
LAB_004af46d:
    iVar17 = iVar17 + 1;
  } while( true );
}

Assistant:

void Unr_ManSetup( Unr_Man_t * p, int fVerbose )
{
    Vec_Int_t * vRoots, * vRoots2, * vMap;
    Unr_Obj_t * pUnrObj;
    Gia_Obj_t * pObj;
    int i, k, t, iObj, nInts, * pInts;
    abctime clk = Abc_Clock();
    // create zero rank
    assert( Vec_IntSize(p->vOrder) == 0 );
    Vec_IntPush( p->vOrder, 0 );
    Vec_IntPush( p->vOrderLim, Vec_IntSize(p->vOrder) );
    Vec_IntWriteEntry( p->vTents, 0, 0 );
    Vec_IntWriteEntry( p->vRanks, 0, 0 );
    // start from the POs
    vRoots  = Vec_IntAlloc( 100 );
    vRoots2 = Vec_IntAlloc( 100 );
    Gia_ManForEachPo( p->pGia, pObj, i )
        Unr_ManSetup_rec( p, Gia_ObjId(p->pGia, pObj), 0, vRoots );
    // collect tents
    while ( Vec_IntSize(vRoots) > 0 )
    {
        Vec_IntPush( p->vOrderLim, Vec_IntSize(p->vOrder) );
        Vec_IntClear( vRoots2 );
        Vec_IntForEachEntry( vRoots, iObj, i )
            Unr_ManSetup_rec( p, iObj, Vec_IntSize(p->vOrderLim)-1, vRoots2 );
        ABC_SWAP( Vec_Int_t *, vRoots, vRoots2 );
    }
    Vec_IntPush( p->vOrderLim, Vec_IntSize(p->vOrder) );
    Vec_IntFree( vRoots );
    Vec_IntFree( vRoots2 );
    // allocate memory
    nInts = 0;
    Vec_IntForEachEntry( p->vOrder, iObj, i )
        nInts += Unr_ObjSizeInt( Vec_IntEntry(p->vRanks, iObj) + 1 );
    p->pObjs = pInts = ABC_CALLOC( int, nInts );
    p->pEnd = p->pObjs + nInts;
    // create const0 node
    pUnrObj = Unr_ManObj( p, pInts - p->pObjs );
    pUnrObj->RankMax = Vec_IntEntry(p->vRanks, 0) + 1;
    pUnrObj->uRDiff0 = pUnrObj->uRDiff1 = UNR_DIFF_NULL;
    pUnrObj->Res[0]  = 0; // const0
    // map the objects
    vMap = Vec_IntStartFull( p->nObjs );
    Vec_IntWriteEntry( vMap, 0, pInts - p->pObjs );
    pInts += Unr_ObjSize(pUnrObj);
    // mark up the entries
    assert( Vec_IntSize(p->vObjLim) == 0 );
    for ( t = Vec_IntSize(p->vOrderLim) - 2; t >= 0; t-- )
    {
        int Beg = Vec_IntEntry(p->vOrderLim, t);
        int End = Vec_IntEntry(p->vOrderLim, t+1);
        Vec_IntPush( p->vObjLim, pInts - p->pObjs );
        Vec_IntForEachEntryStartStop( p->vOrder, iObj, i, Beg, End )
        {
            pObj = Gia_ManObj( p->pGia, iObj );
            pUnrObj = Unr_ManObj( p, pInts - p->pObjs );
            pUnrObj->uRDiff0 = pUnrObj->uRDiff1 = UNR_DIFF_NULL;
            if ( Gia_ObjIsAnd(pObj) || Gia_ObjIsCo(pObj) )
                pUnrObj->uRDiff0 = Abc_MaxInt(0, Vec_IntEntry(p->vTents, iObj) - Vec_IntEntry(p->vTents, Gia_ObjFaninId0(pObj, iObj)) - 1);
            if ( Gia_ObjIsAnd(pObj) )
                pUnrObj->uRDiff1 = Abc_MaxInt(0, Vec_IntEntry(p->vTents, iObj) - Vec_IntEntry(p->vTents, Gia_ObjFaninId1(pObj, iObj)) - 1);
            else if ( Gia_ObjIsRo(p->pGia, pObj) )
                pUnrObj->uRDiff0 = 0;
            pUnrObj->RankMax = Vec_IntEntry(p->vRanks, iObj) + 1;
            pUnrObj->RankCur = UNR_DIFF_NULL;
            pUnrObj->OrigId  = iObj;
            for ( k = 0; k < (int)pUnrObj->RankMax; k++ )
                pUnrObj->Res[k] = -1;
            assert( ((pInts - p->pObjs) & 1) == 0 ); // align for 64-bits
            Vec_IntWriteEntry( vMap, iObj, pInts - p->pObjs );
            pInts += Unr_ObjSize( pUnrObj );
        }
    }
    assert( pInts - p->pObjs == nInts );
    // label the objects
    Gia_ManForEachObj( p->pGia, pObj, i )
    {
        if ( Vec_IntEntry(vMap, i) == -1 )
            continue;
        pUnrObj = Unr_ManObj( p, Vec_IntEntry(vMap, i) );
        if ( Gia_ObjIsAnd(pObj) || Gia_ObjIsCo(pObj) )
        {
            pUnrObj->hFan0   = Vec_IntEntry( vMap, Gia_ObjFaninId0(pObj, i) );
            pUnrObj->fCompl0 = Gia_ObjFaninC0(pObj);
            pUnrObj->fItIsPo = Gia_ObjIsPo(p->pGia, pObj);
        }
        if ( Gia_ObjIsAnd(pObj) )
        {
            pUnrObj->hFan1   = Vec_IntEntry( vMap, Gia_ObjFaninId1(pObj, i) );
            pUnrObj->fCompl1 = Gia_ObjFaninC1(pObj);
        }
        else if ( Gia_ObjIsRo(p->pGia, pObj) )
        {
            pUnrObj->hFan0   = Vec_IntEntry( vMap, Gia_ObjId(p->pGia, Gia_ObjRoToRi(p->pGia, pObj)) );
            pUnrObj->fCompl0 = 0;
        }
        else if ( Gia_ObjIsPi(p->pGia, pObj) )
        {
            pUnrObj->hFan0   = Gia_ObjCioId(pObj);           // remember CIO id
            pUnrObj->hFan1   = Vec_IntEntry(p->vTents, i);   // remember tent
            pUnrObj->fItIsPi = 1;
        }
    }
    // store CI/PO objects;
    Gia_ManForEachCi( p->pGia, pObj, i )
        Vec_IntPush( p->vCiMap, Vec_IntEntry(vMap, Gia_ObjId(p->pGia, pObj)) );
    Gia_ManForEachCo( p->pGia, pObj, i )
        Vec_IntPush( p->vCoMap, Vec_IntEntry(vMap, Gia_ObjId(p->pGia, pObj)) );
    Vec_IntFreeP( &vMap );
    // print stats
    if ( fVerbose )
    {
        Unr_ManProfileRanks( p->vRanks );
        printf( "Memory usage = %6.2f MB  ", 4.0 * nInts / (1<<20) );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    }
    Vec_IntFreeP( &p->vOrder );
    Vec_IntFreeP( &p->vOrderLim );
    Vec_IntFreeP( &p->vRanks );
    Vec_IntFreeP( &p->vTents );
}